

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bytedata160.cpp
# Opt level: O0

void __thiscall
ByteData160_EqualsUnMatch_Test::ByteData160_EqualsUnMatch_Test(ByteData160_EqualsUnMatch_Test *this)

{
  ByteData160_EqualsUnMatch_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__ByteData160_EqualsUnMatch_Test_009d9ed8;
  return;
}

Assistant:

TEST(ByteData160, EqualsUnMatch) {
  ByteData160 byte_data1 = ByteData160(
      "1234567890123456789012345678901234567890");
  ByteData160 byte_data2 = ByteData160(
      "0234567890123456789012345678901234567890");
  bool is_equals = byte_data1.Equals(byte_data2);

  EXPECT_FALSE(is_equals);
}